

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::ShutdownedWrite::pumpTo
          (ShutdownedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  int iVar1;
  
  if (_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
    if (iVar1 != 0) {
      kj::_::ImmediatePromiseNodeBase::ImmediatePromiseNodeBase
                ((ImmediatePromiseNodeBase *)
                 _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE._0_8_ = &PTR_destroy_006422f8;
      __cxa_atexit(kj::_::ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase,
                   _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE,&__dso_handle);
      __cxa_guard_release(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
    }
  }
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)_ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      return constPromise<uint64_t, 0>();
    }